

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O2

bool __thiscall duckdb::AlpAnalyzeState<float>::HasEnoughSpace(AlpAnalyzeState<float> *this)

{
  ushort uVar1;
  idx_t iVar2;
  uint64_t uVar3;
  idx_t iVar4;
  
  iVar2 = this->current_bytes_used_in_segment;
  uVar1 = (this->state).exceptions_count;
  uVar3 = (this->state).bp_size;
  iVar4 = CompressionInfo::GetBlockSize(&(this->super_AnalyzeState).info);
  return ((ulong)uVar1 * 6 + iVar2 + uVar3 + 0x18 & 0xfffffffffffffff8) <= iVar4 - 4;
}

Assistant:

bool HasEnoughSpace() {
		idx_t bytes_to_be_used = AlignValue(current_bytes_used_in_segment + RequiredSpace());
		// We have enough space if the already used space + the required space for a new vector
		// does not exceed the space of the block - the segment header (the pointer to the metadata)
		return bytes_to_be_used <= (info.GetBlockSize() - AlpConstants::METADATA_POINTER_SIZE);
	}